

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O1

void __thiscall bgui::FileImageWindow::saveContent(FileImageWindow *this,char *basename)

{
  int iVar1;
  long lVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar ***pppuVar5;
  ulong uVar6;
  Image *pIVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string name;
  string base;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char *local_b0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_a8;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108.depth = 0;
  local_108.width = 0;
  local_108.height = 0;
  local_108.n = 0;
  local_108.pixel = (uchar *)0x0;
  local_108.row = (uchar **)0x0;
  local_108.img = (uchar ***)0x0;
  local_b0 = basename;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_108,0,0,1);
  BaseWindow::getContent((BaseWindow *)this,&local_108);
  if (local_108.height < 1) {
    uVar6 = 0;
  }
  else {
    uVar9 = (ulong)local_108.depth;
    uVar8 = 0;
    do {
      bVar16 = (long)uVar9 < 1;
      if (0 < local_108.depth) {
        uVar14 = 0;
        bVar16 = false;
        uVar6 = local_108.width;
        do {
          while ((long)uVar6 < 1) {
            uVar14 = uVar14 + 1;
            bVar16 = uVar9 <= uVar14;
            uVar6 = local_108.width;
            if (uVar14 == uVar9) goto LAB_001156c5;
          }
          lVar12 = uVar6 - 1;
          uVar6 = uVar6 - 1;
        } while (local_108.img[uVar14][uVar8][lVar12] == '\0');
      }
LAB_001156c5:
      uVar6 = uVar8;
    } while ((bVar16) && (uVar8 = uVar8 + 1, uVar6 = local_108.height, uVar8 != local_108.height));
  }
  uVar9 = (ulong)local_108.depth;
  uVar8 = local_108.height;
  do {
    uVar14 = local_108.height >> 0x3f & local_108.height;
    if ((long)uVar8 < 1) break;
    bVar16 = (long)uVar9 < 1;
    if (0 < local_108.depth) {
      uVar11 = 0;
      bVar16 = false;
      uVar14 = local_108.width;
      do {
        while ((long)uVar14 < 1) {
          uVar11 = uVar11 + 1;
          bVar16 = uVar9 <= uVar11;
          uVar14 = local_108.width;
          if (uVar11 == uVar9) goto LAB_00115740;
        }
        lVar12 = uVar14 - 1;
        uVar14 = uVar14 - 1;
      } while (local_108.img[uVar11][uVar8 - 1][lVar12] == '\0');
    }
LAB_00115740:
    uVar14 = uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar16);
  if (local_108.width < 1) {
    uVar8 = 0;
  }
  else {
    uVar11 = (ulong)local_108.depth;
    uVar9 = 0;
    do {
      bVar16 = (long)uVar11 < 1;
      if (0 < local_108.depth) {
        uVar15 = 0;
        bVar16 = false;
        uVar8 = local_108.height;
        do {
          while ((long)uVar8 < 1) {
            uVar15 = uVar15 + 1;
            bVar16 = uVar11 <= uVar15;
            uVar8 = local_108.height;
            if (uVar15 == uVar11) goto LAB_0011579d;
          }
          lVar12 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (local_108.img[uVar15][lVar12][uVar9] == '\0');
      }
LAB_0011579d:
      uVar8 = uVar9;
    } while ((bVar16) && (uVar9 = uVar9 + 1, uVar8 = local_108.width, uVar9 != local_108.width));
  }
  uVar11 = (ulong)local_108.depth;
  uVar9 = local_108.width;
  do {
    uVar15 = local_108.width >> 0x3f & local_108.width;
    if ((long)uVar9 < 1) break;
    bVar16 = (long)uVar11 < 1;
    if (0 < local_108.depth) {
      uVar10 = 0;
      bVar16 = false;
      uVar15 = local_108.height;
      do {
        while ((long)uVar15 < 1) {
          uVar10 = uVar10 + 1;
          bVar16 = uVar11 <= uVar10;
          uVar15 = local_108.height;
          if (uVar10 == uVar11) goto LAB_00115810;
        }
        lVar12 = uVar15 - 1;
        uVar15 = uVar15 - 1;
      } while (local_108.img[uVar10][lVar12][uVar9 - 1] == '\0');
    }
LAB_00115810:
    uVar15 = uVar9;
    uVar9 = uVar9 - 1;
  } while (bVar16);
  lVar12 = uVar15 - uVar8;
  lVar13 = uVar14 - uVar6;
  if ((lVar13 == 0 || (long)uVar14 < (long)uVar6) || (lVar12 == 0 || (long)uVar15 < (long)uVar8)) {
    BaseWindow::setInfoLine((BaseWindow *)this,"Empty image!",true,true);
  }
  else {
    if (((uVar8 != 0 || uVar6 != 0) || (lVar12 < local_108.width)) || (lVar13 < local_108.height)) {
      gimage::cropImage<unsigned_char>(&local_a8,&local_108,uVar8,uVar6,lVar12,lVar13);
      pppuVar5 = local_108.img;
      ppuVar4 = local_108.row;
      puVar3 = local_108.pixel;
      lVar2 = local_108.n;
      lVar13 = local_108.height;
      lVar12 = local_108.width;
      iVar1 = local_108.depth;
      local_108.depth = local_a8.depth;
      local_a8.depth = iVar1;
      local_108.width = local_a8.width;
      local_108.height = local_a8.height;
      local_a8.width = lVar12;
      local_a8.height = lVar13;
      local_108.n = local_a8.n;
      local_a8.n = lVar2;
      local_108.pixel = local_a8.pixel;
      local_108.row = local_a8.row;
      local_a8.pixel = puVar3;
      local_a8.row = ppuVar4;
      local_108.img = local_a8.img;
      local_a8.img = pppuVar5;
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_a8);
    }
    std::__cxx11::string::string((string *)&local_a8,local_b0,(allocator *)&local_d0);
    lVar12 = std::__cxx11::string::rfind((char)&local_a8,0x2e);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,CONCAT44(local_a8._4_4_,local_a8.depth),
               local_a8.width + CONCAT44(local_a8._4_4_,local_a8.depth));
    gimage::getNewImageName(&local_d0,local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (local_d0._M_string_length == 0) {
      BaseWindow::setInfoLine
                ((BaseWindow *)this,"Sorry, cannot determine file name for storing image!",true,true
                );
    }
    else {
      pIVar7 = (Image *)gimage::getImageIO();
      gimage::ImageIO::save(pIVar7,(char *)&local_108);
      std::operator+(&local_50,"Saved as ",&local_d0);
      BaseWindow::setInfoLine((BaseWindow *)this,local_50._M_dataplus._M_p,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_a8._4_4_,local_a8.depth) != &local_a8.height) {
      operator_delete((undefined1 *)CONCAT44(local_a8._4_4_,local_a8.depth));
    }
  }
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_108);
  return;
}

Assistant:

void FileImageWindow::saveContent(const char *basename)
{
  gimage::ImageU8 image;

  getContent(image);

  // strip black borders from image

  long k0=0;

  while (k0 < image.getHeight() && isImageRowEmpty(image, k0))
  {
    k0++;
  }

  long k1=image.getHeight()-1;

  while (k1 >= 0 && isImageRowEmpty(image, k1))
  {
    k1--;
  }

  long i0=0;

  while (i0 < image.getWidth() && isImageColumnEmpty(image, i0))
  {
    i0++;
  }

  long i1=image.getWidth()-1;

  while (i1 >= 0 && isImageColumnEmpty(image, i1))
  {
    i1--;
  }

  if (i0 <= i1 && k0 <= k1)
  {
    if (i0 > 0 || k0 > 0 || i1-i0+1 < image.getWidth() ||
        k1-k0+1 < image.getHeight())
    {
      image=cropImage(image, i0, k0, i1-i0+1, k1-k0+1);
    }

    // find file name that is not used

    std::string base=basename;

    size_t i=base.rfind('.');

    if (i != base.npos)
    {
      base=base.substr(0, i);
    }

    std::string name=gimage::getNewImageName(base);

    if (name.size() > 0)
    {
      gimage::getImageIO().save(image, name.c_str());
      setInfoLine(("Saved as "+name).c_str());
    }
    else
    {
      setInfoLine("Sorry, cannot determine file name for storing image!");
    }
  }
  else
  {
    setInfoLine("Empty image!");
  }
}